

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawCircleGradient(int centerX,int centerY,float radius,Color inner,Color outer)

{
  uint uVar1;
  float x;
  float y;
  float fVar2;
  float fVar3;
  undefined1 local_44;
  
  rlBegin(4);
  x = (float)centerX;
  y = (float)centerY;
  local_44 = outer.r;
  uVar1 = 0;
  while (uVar1 < 0x168) {
    rlColor4ub(inner.r,inner.g,inner.b,inner.a);
    rlVertex2f(x,y);
    rlColor4ub(local_44,outer.g,outer.b,outer.a);
    fVar3 = (float)(int)(uVar1 + 10) * 0.017453292;
    fVar2 = cosf(fVar3);
    fVar3 = sinf(fVar3);
    rlVertex2f(fVar2 * radius + x,fVar3 * radius + y);
    rlColor4ub(local_44,outer.g,outer.b,outer.a);
    fVar2 = cosf((float)(int)uVar1 * 0.017453292);
    fVar3 = sinf((float)(int)uVar1 * 0.017453292);
    rlVertex2f(fVar2 * radius + x,fVar3 * radius + y);
    uVar1 = uVar1 + 10;
  }
  rlEnd();
  return;
}

Assistant:

void DrawCircleGradient(int centerX, int centerY, float radius, Color inner, Color outer)
{
    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < 360; i += 10)
        {
            rlColor4ub(inner.r, inner.g, inner.b, inner.a);
            rlVertex2f((float)centerX, (float)centerY);
            rlColor4ub(outer.r, outer.g, outer.b, outer.a);
            rlVertex2f((float)centerX + cosf(DEG2RAD*(i + 10))*radius, (float)centerY + sinf(DEG2RAD*(i + 10))*radius);
            rlColor4ub(outer.r, outer.g, outer.b, outer.a);
            rlVertex2f((float)centerX + cosf(DEG2RAD*i)*radius, (float)centerY + sinf(DEG2RAD*i)*radius);
        }
    rlEnd();
}